

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::Reflection::UnsafeArenaSetAllocatedMessage
          (Reflection *this,Message *message,Message *sub_message,FieldDescriptor *field)

{
  uint *puVar1;
  ReflectionSchema *this_00;
  byte bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  long *plVar5;
  ulong uVar6;
  undefined8 *puVar7;
  Nonnull<const_char_*> pcVar8;
  bool bVar9;
  OneofDescriptor *pOVar10;
  char *description;
  Descriptor *pDVar11;
  Metadata MVar12;
  
  MVar12 = Message::GetMetadata(message);
  if (MVar12.reflection != this) goto LAB_002a620d;
  pDVar11 = this->descriptor_;
  if (field->containing_type_ != pDVar11) {
    description = "Field does not match message type.";
    goto LAB_002a625d;
  }
  bVar2 = field->field_0x1;
  bVar9 = (bool)((bVar2 & 0x20) >> 5);
  if (0xbf < bVar2 == bVar9) {
    pcVar8 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar8 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                       (bVar9,0xbf < bVar2,
                        "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  }
  if (pcVar8 == (Nonnull<const_char_*>)0x0) {
    if ((field->field_0x1 & 0x20) == 0) {
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 10) {
        anon_unknown_6::ReportReflectionUsageTypeError
                  (this->descriptor_,field,"SetAllocatedMessage",CPPTYPE_MESSAGE);
      }
      this_00 = &this->schema_;
      if ((field->field_0x1 & 8) != 0) {
        uVar3 = internal::ReflectionSchema::GetExtensionSetOffset(this_00);
        internal::ExtensionSet::UnsafeArenaSetAllocatedMessage
                  ((ExtensionSet *)
                   ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3),
                   field->number_,field->type_,field,&sub_message->super_MessageLite);
        return;
      }
      bVar9 = internal::ReflectionSchema::InRealOneof(this_00,field);
      if (bVar9) {
        if (sub_message == (Message *)0x0) {
          if ((field->field_0x1 & 0x10) == 0) {
            pOVar10 = (OneofDescriptor *)0x0;
          }
          else {
            pOVar10 = (field->scope_).containing_oneof;
            if (pOVar10 == (OneofDescriptor *)0x0) goto LAB_002a627d;
          }
          ClearOneof(this,message,pOVar10);
          return;
        }
        if ((field->field_0x1 & 0x10) == 0) {
          pOVar10 = (OneofDescriptor *)0x0;
        }
        else {
          pOVar10 = (field->scope_).containing_oneof;
          if (pOVar10 == (OneofDescriptor *)0x0) goto LAB_002a627d;
        }
        ClearOneof(this,message,pOVar10);
        VerifyFieldType<google::protobuf::Message*>(this,field);
        puVar7 = (undefined8 *)MutableRawImpl(this,message,field);
        *puVar7 = sub_message;
        if ((field->field_0x1 & 0x10) == 0) {
          pOVar10 = (OneofDescriptor *)0x0;
        }
        else {
          pOVar10 = (field->scope_).containing_oneof;
          if (pOVar10 == (OneofDescriptor *)0x0) {
LAB_002a627d:
            internal::protobuf_assumption_failed
                      ("res != nullptr",
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xb31);
          }
        }
        if ((pOVar10->field_count_ != 1) || ((pOVar10->fields_->field_0x1 & 2) == 0)) {
          *(int *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                  (ulong)(uint)((int)((ulong)((long)pOVar10 -
                                             (long)pOVar10->containing_type_->oneof_decls_) >> 3) *
                                -0x24924924 + (this->schema_).oneof_case_offset_)) = field->number_;
          return;
        }
LAB_002a61f9:
        UnsafeArenaSetAllocatedMessage();
      }
      else {
        if (sub_message != (Message *)0x0) {
          SetHasBit(this,message,field);
          goto LAB_002a60d4;
        }
        if ((field->options_->field_0)._impl_.weak_ == true) {
          UnsafeArenaSetAllocatedMessage();
          goto LAB_002a61f9;
        }
        uVar3 = internal::ReflectionSchema::HasBitIndex(this_00,field);
        if (uVar3 == 0xffffffff) {
LAB_002a60d4:
          VerifyFieldType<google::protobuf::Message*>(this,field);
          plVar5 = (long *)MutableRawImpl(this,message,field);
          uVar6 = (message->super_MessageLite)._internal_metadata_.ptr_;
          if ((uVar6 & 1) != 0) {
            uVar6 = *(ulong *)(uVar6 & 0xfffffffffffffffe);
          }
          if ((uVar6 == 0) && ((long *)*plVar5 != (long *)0x0)) {
            (**(code **)(*(long *)*plVar5 + 8))();
          }
          *plVar5 = (long)sub_message;
          return;
        }
        if ((this->schema_).has_bits_offset_ != -1) {
          bVar2 = (byte)uVar3 & 0x1f;
          uVar4 = internal::ReflectionSchema::HasBitsOffset(this_00);
          puVar1 = (uint *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                           (ulong)(uVar3 >> 5) * 4 + (ulong)uVar4);
          *puVar1 = *puVar1 & (-2 << bVar2 | 0xfffffffeU >> 0x20 - bVar2);
          goto LAB_002a60d4;
        }
      }
      UnsafeArenaSetAllocatedMessage();
LAB_002a620d:
      pDVar11 = this->descriptor_;
      MVar12 = Message::GetMetadata(message);
      anon_unknown_6::ReportReflectionUsageMessageError
                (pDVar11,MVar12.descriptor,field,"SetAllocatedMessage");
    }
  }
  else {
    UnsafeArenaSetAllocatedMessage();
  }
  pDVar11 = this->descriptor_;
  description = "Field is repeated; the method requires a singular field.";
LAB_002a625d:
  anon_unknown_6::ReportReflectionUsageError(pDVar11,field,"SetAllocatedMessage",description);
}

Assistant:

void Reflection::UnsafeArenaSetAllocatedMessage(
    Message* message, Message* sub_message,
    const FieldDescriptor* field) const {
  USAGE_MUTABLE_CHECK_ALL(SetAllocatedMessage, SINGULAR, MESSAGE);


  if (field->is_extension()) {
    MutableExtensionSet(message)->UnsafeArenaSetAllocatedMessage(
        field->number(), field->type(), field, sub_message);
  } else {
    if (schema_.InRealOneof(field)) {
      if (sub_message == nullptr) {
        ClearOneof(message, field->containing_oneof());
        return;
      }
        ClearOneof(message, field->containing_oneof());
        *MutableRaw<Message*>(message, field) = sub_message;
      SetOneofCase(message, field);
      return;
    }

    if (sub_message == nullptr) {
      ClearHasBit(message, field);
    } else {
      SetHasBit(message, field);
    }
    Message** sub_message_holder = MutableRaw<Message*>(message, field);
    if (message->GetArena() == nullptr) {
      delete *sub_message_holder;
    }
    *sub_message_holder = sub_message;
  }
}